

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_window.c
# Opt level: O0

void applySizeLimits(_GLFWwindow *window,int *width,int *height)

{
  float ratio;
  int *height_local;
  int *width_local;
  _GLFWwindow *window_local;
  
  if ((window->numer != -1) && (window->denom != -1)) {
    *height = (int)((float)*width / ((float)window->numer / (float)window->denom));
  }
  if ((window->minwidth == -1) || (window->minwidth <= *width)) {
    if ((window->maxwidth != -1) && (window->maxwidth < *width)) {
      *width = window->maxwidth;
    }
  }
  else {
    *width = window->minwidth;
  }
  if ((window->minheight == -1) || (window->minheight <= *height)) {
    if ((window->maxheight != -1) && (window->maxheight < *height)) {
      *height = window->maxheight;
    }
  }
  else {
    *height = window->minheight;
  }
  return;
}

Assistant:

static void applySizeLimits(_GLFWwindow* window, int* width, int* height)
{
    if (window->numer != GLFW_DONT_CARE && window->denom != GLFW_DONT_CARE)
    {
        const float ratio = (float) window->numer / (float) window->denom;
        *height = (int) (*width / ratio);
    }

    if (window->minwidth != GLFW_DONT_CARE && *width < window->minwidth)
        *width = window->minwidth;
    else if (window->maxwidth != GLFW_DONT_CARE && *width > window->maxwidth)
        *width = window->maxwidth;

    if (window->minheight != GLFW_DONT_CARE && *height < window->minheight)
        *height = window->minheight;
    else if (window->maxheight != GLFW_DONT_CARE && *height > window->maxheight)
        *height = window->maxheight;
}